

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::dht_mutable_item_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_mutable_item_alert *this)

{
  int64_t iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  difference_type in_RCX;
  span<const_char> in;
  allocator<char> local_595 [13];
  string local_588;
  aux *local_568;
  char *local_560;
  string local_558;
  char local_538 [8];
  char msg [1299];
  dht_mutable_item_alert *this_local;
  
  span<char_const>::span<std::array<char,32ul>,char,void>((span<char_const> *)&local_568,&this->key)
  ;
  in.m_len = in_RCX;
  in.m_ptr = local_560;
  libtorrent::aux::to_hex_abi_cxx11_(&local_558,local_568,in);
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  iVar1 = this->seq;
  pcVar4 = "non-auth";
  if ((this->authoritative & 1U) != 0) {
    pcVar4 = "auth";
  }
  entry::to_string_abi_cxx11_(&local_588,&this->item,false);
  uVar5 = std::__cxx11::string::c_str();
  snprintf(local_538,0x513,"DHT mutable item (key=%s salt=%s seq=%ld %s) [ %s ]",uVar2,uVar3,iVar1,
           pcVar4,uVar5);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_538,local_595);
  std::allocator<char>::~allocator(local_595);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_mutable_item_alert::message() const
	{
		char msg[MAX_DHT_MUTABLE_DATA_LENGTH + 50];
		std::snprintf(msg, sizeof(msg), "DHT mutable item (key=%s salt=%s seq=%" PRId64 " %s) [ %s ]"
			, aux::to_hex(key).c_str()
			, salt.c_str()
			, seq
			, authoritative ? "auth" : "non-auth"
			, item.to_string().c_str());
		return msg;
	}